

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.c
# Opt level: O0

int verify_miniscript_and_v(miniscript_node_t *node,miniscript_node_t *parent)

{
  uint32_t uVar1;
  int local_1c;
  int ret;
  miniscript_node_t *parent_local;
  miniscript_node_t *node_local;
  
  local_1c = verify_miniscript_two_param_check(node,parent);
  if (local_1c == 0) {
    uVar1 = verify_miniscript_and_v_property
                      (node->child->type_properties,node->child->next->type_properties);
    node->type_properties = uVar1;
    if (node->type_properties == 0) {
      local_1c = -2;
    }
  }
  return local_1c;
}

Assistant:

static int verify_miniscript_and_v(struct miniscript_node_t *node, struct miniscript_node_t *parent)
{
    int ret = verify_miniscript_two_param_check(node, parent);
    if (ret == WALLY_OK) {
        node->type_properties = verify_miniscript_and_v_property(
            node->child->type_properties,
            node->child->next->type_properties);
        if (!node->type_properties)
            ret = WALLY_EINVAL;
    }
    return ret;
}